

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArtificialPopulation.cpp
# Opt level: O0

void __thiscall
ArtificialPopulation::ArtificialPopulation(ArtificialPopulation *this,ANN *a,Parameters *param)

{
  int iVar1;
  int iVar2;
  ANN *in_RSI;
  int *in_RDI;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int *y;
  Matrix<double,__1,__1,_0,__1,__1> *this_00;
  Population *in_stack_ffffffffffffffd0;
  
  Population::Population
            ((Population *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  *(undefined ***)in_RDI = &PTR_update_0017fbd8;
  this_00 = (Matrix<double,__1,__1,_0,__1,__1> *)(in_RDI + 0x1a);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x16196f);
  y = in_RDI + 0x20;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x161984);
  iVar1 = ANN::getInputSize(in_RSI);
  in_RDI[8] = iVar1;
  iVar1 = ANN::getInputSize(in_RSI);
  in_RDI[9] = iVar1;
  iVar1 = ANN::getOutputSize(in_RSI);
  in_RDI[10] = iVar1;
  Population::initialize(in_stack_ffffffffffffffd0);
  *(ANN **)(in_RDI + 0x18) = in_RSI;
  iVar2 = ANN::getInputSize(*(ANN **)(in_RDI + 0x18));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>(this_00,in_RDI,y);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffff88);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x161a41);
  return;
}

Assistant:

ArtificialPopulation::ArtificialPopulation(ANN* a,  Parameters* param) {
    numberOfNeurons = a->getInputSize();
    numberOfInputNeurons = a->getInputSize();
    numberOfOutputNeurons = a->getOutputSize();
    initialize();
    ann = a;
    annInput = Eigen::MatrixXd(1, ann->getInputSize());
}